

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd.h
# Opt level: O3

void ncnn::get_optimal_tile_mnk(int M,int N,int K,int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  ulong uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  float fVar8;
  
  uVar4 = get_cpu_level2_cache_size();
  if (nT == 0) {
    nT = get_physical_big_cpu_count();
  }
  if ((long)(int)uVar4 < 0) {
    fVar8 = (float)((ulong)(uVar4 & 1) | (ulong)(long)(int)uVar4 >> 1);
    fVar8 = fVar8 + fVar8;
  }
  else {
    fVar8 = (float)(int)uVar4;
  }
  fVar2 = fVar8 * 0.25;
  auVar3 = vsqrtss_avx(ZEXT416((uint)(fVar8 * 0.083333336)),ZEXT416((uint)(fVar8 * 0.083333336)));
  uVar5 = (uint)auVar3._0_4_;
  uVar4 = uVar5 + 7;
  if (-1 < (int)uVar5) {
    uVar4 = uVar5;
  }
  uVar4 = uVar4 & 0xfffffff8;
  if ((int)uVar4 < 9) {
    uVar4 = 8;
  }
  *TILE_M = uVar4;
  iVar6 = get_physical_cpu_count();
  if (nT <= iVar6) {
    iVar6 = nT;
  }
  uVar7 = iVar6 * *TILE_M;
  iVar6 = (int)(M + uVar7 + -1) / (int)uVar7;
  iVar6 = (M + iVar6 + -1) / iVar6;
  uVar5 = iVar6 + 7;
  uVar4 = iVar6 + 0xe;
  if (-1 < (int)uVar5) {
    uVar4 = uVar5;
  }
  uVar5 = uVar4 & 0xfffffff8;
  if ((int)uVar7 <= (int)(uVar4 & 0xfffffff8)) {
    uVar5 = uVar7;
  }
  uVar4 = uVar5;
  if (1 < nT) {
    iVar6 = 1;
    if (1 < (int)uVar5 / nT) {
      iVar6 = (int)uVar5 / nT;
    }
    uVar4 = iVar6 + 7U & 0x7ffffff8;
    if ((int)uVar5 <= (int)uVar4) {
      uVar4 = uVar5;
    }
  }
  *TILE_M = uVar4;
  auVar3 = vsqrtss_avx(ZEXT416((uint)fVar2),ZEXT416((uint)fVar2));
  uVar5 = (uint)(auVar3._0_4_ - (float)(int)uVar4);
  uVar4 = uVar5 + 7;
  if (-1 < (int)uVar5) {
    uVar4 = uVar5;
  }
  uVar5 = 8;
  if (8 < (int)(uVar4 & 0xfffffff8)) {
    uVar5 = uVar4 & 0xfffffff8;
  }
  iVar6 = (int)(uVar5 + K + -1) / (int)uVar5;
  iVar6 = (iVar6 + K + -1) / iVar6;
  uVar7 = iVar6 + 7;
  uVar4 = iVar6 + 0xe;
  if (-1 < (int)uVar7) {
    uVar4 = uVar7;
  }
  uVar7 = uVar4 & 0xfffffff8;
  if ((int)uVar5 <= (int)(uVar4 & 0xfffffff8)) {
    uVar7 = uVar5;
  }
  *TILE_K = uVar7;
  if (0 < N) {
    uVar5 = (uint)((fVar2 - (float)(int)(*TILE_M * uVar7)) / (float)(int)(*TILE_M + uVar7));
    uVar4 = uVar5 + 3;
    if (-1 < (int)uVar5) {
      uVar4 = uVar5;
    }
    uVar5 = 4;
    if (4 < (int)(uVar4 & 0xfffffffc)) {
      uVar5 = uVar4 & 0xfffffffc;
    }
    uVar1 = (ulong)((N + uVar5) - 1) / (ulong)uVar5;
    uVar4 = (int)(((N + (int)uVar1) - 1) / uVar1) + 3U & 0xfffffffc;
    if (uVar5 <= uVar4) {
      uVar4 = uVar5;
    }
    *TILE_N = uVar4;
  }
  return;
}

Assistant:

static void get_optimal_tile_mnk(int M, int N, int K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const size_t l2_cache_size = get_cpu_level2_cache_size();

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    // solve M
    {
        int tile_size = (int)sqrt((float)l2_cache_size / sizeof(float) / 3);

#if __AVX512F__
        TILE_M = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_M = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_M = std::max(4, tile_size / 4 * 4);
#else
        TILE_M = std::max(2, tile_size / 2 * 2);
#endif

        TILE_M *= std::min(nT, get_physical_cpu_count());

        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif

        if (nT > 1)
        {
#if __AVX512F__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
        }
    }

    // solve K
    {
        int tile_size = (int)(sqrt((float)l2_cache_size / sizeof(float)) - TILE_M);

#if __AVX512F__
        TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_K = std::max(4, tile_size / 4 * 4);
#else
        TILE_K = std::max(2, tile_size / 2 * 2);
#endif

        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 3) / 4 * 4);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif
    }

    if (N > 0)
    {
        int tile_size = (int)(((float)l2_cache_size / sizeof(float) - TILE_M * TILE_K) / (TILE_M + TILE_K));

#if __AVX512F__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __AVX__
        TILE_N = std::max(4, tile_size / 4 * 4);
#elif __SSE2__
        TILE_N = std::max(4, tile_size / 4 * 4);
#else
        TILE_N = std::max(1, tile_size);
#endif

        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __AVX512F__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __AVX__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#elif __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif
    }
}